

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceTests.cpp
# Opt level: O1

void setupStateFeature(FeatureDescription *feature,string *name)

{
  uint64_t *this;
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  SequenceFeatureType *this_00;
  SizeRange *pSVar4;
  FeatureType *pFVar5;
  StateFeatureType *pSVar6;
  ArrayFeatureType *pAVar7;
  long *plVar8;
  undefined8 *puVar9;
  Arena *pAVar10;
  
  uVar3 = (feature->super_MessageLite)._internal_metadata_.ptr_;
  puVar9 = (undefined8 *)(uVar3 & 0xfffffffffffffffc);
  if ((uVar3 & 1) != 0) {
    puVar9 = (undefined8 *)*puVar9;
  }
  google::protobuf::internal::ArenaStringPtr::Set(&feature->name_,name,puVar9);
  if (feature->type_ == (FeatureType *)0x0) {
    uVar3 = (feature->super_MessageLite)._internal_metadata_.ptr_;
    pAVar10 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar10);
    feature->type_ = pFVar5;
  }
  pFVar5 = feature->type_;
  if (pFVar5->_oneof_case_[0] != 8) {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 8;
    uVar3 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar10 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
    pSVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StateFeatureType>
                       (pAVar10);
    (pFVar5->Type_).statetype_ = pSVar6;
  }
  pSVar6 = (pFVar5->Type_).statetype_;
  if (pSVar6->_oneof_case_[0] != 1) {
    CoreML::Specification::StateFeatureType::clear_Type(pSVar6);
    pSVar6->_oneof_case_[0] = 1;
    uVar3 = (pSVar6->super_MessageLite)._internal_metadata_.ptr_;
    pAVar10 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
    pAVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar10);
    (pSVar6->Type_).arraytype_ = pAVar7;
  }
  ((pSVar6->Type_).arraytype_)->datatype_ = 0x10010;
  if (feature->type_ == (FeatureType *)0x0) {
    uVar3 = (feature->super_MessageLite)._internal_metadata_.ptr_;
    pAVar10 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
    pFVar5 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar10);
    feature->type_ = pFVar5;
  }
  pFVar5 = feature->type_;
  if (pFVar5->_oneof_case_[0] != 8) {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 8;
    uVar3 = (pFVar5->super_MessageLite)._internal_metadata_.ptr_;
    pAVar10 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
    pSVar6 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::StateFeatureType>
                       (pAVar10);
    (pFVar5->Type_).statetype_ = pSVar6;
  }
  this_00 = (pFVar5->Type_).sequencetype_;
  if (*(int *)((long)&this_00->Type_ + 4) != 1) {
    CoreML::Specification::StateFeatureType::clear_Type((StateFeatureType *)this_00);
    *(undefined4 *)((long)&this_00->Type_ + 4) = 1;
    uVar3 = (this_00->super_MessageLite)._internal_metadata_.ptr_;
    pAVar10 = (Arena *)(uVar3 & 0xfffffffffffffffc);
    if ((uVar3 & 1) != 0) {
      pAVar10 = *(Arena **)pAVar10;
    }
    pAVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar10);
    this_00->sizerange_ = (SizeRange *)pAVar7;
  }
  pSVar4 = this_00->sizerange_;
  this = &pSVar4->lowerbound_;
  uVar1 = (uint)pSVar4->lowerbound_;
  uVar2 = *(uint *)((long)&pSVar4->lowerbound_ + 4);
  if (uVar1 == uVar2) {
    google::protobuf::RepeatedField<long>::Reserve((RepeatedField<long> *)this,uVar2 + 1);
  }
  plVar8 = google::protobuf::RepeatedField<long>::elements((RepeatedField<long> *)this);
  plVar8[uVar1] = 1;
  *(uint *)this = uVar1 + 1;
  return;
}

Assistant:

static void setupStateFeature(Specification::FeatureDescription *feature, const std::string& name) {
    feature->set_name(name);
    feature->mutable_type()->mutable_statetype()->mutable_arraytype()->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_FLOAT16);
    feature->mutable_type()->mutable_statetype()->mutable_arraytype()->add_shape(1);
}